

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<double>_>::SolveSOR
          (TPZMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  complex<double> *pcVar1;
  complex<double> *pcVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double __x;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  double dVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double local_f8;
  double dStack_f0;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  double dStack_c0;
  long *local_b8;
  TPZFMatrix<std::complex<double>_> *local_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  TPZFMatrix<std::complex<double>_> *local_90;
  double *local_88;
  int64_t local_80;
  long local_78;
  long local_70;
  double local_68;
  double dStack_60;
  long local_50;
  long local_48;
  long local_40;
  REAL local_38;
  undefined8 extraout_XMM0_Qb;
  
  local_b8 = numiterations;
  local_b0 = F;
  local_38 = overrelax;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_88 = tol;
  dStack_c0 = 0.0;
  local_c8 = (undefined1  [8])*tol;
  local_f8 = 2.0;
  dStack_f0 = 0.0;
  local_90 = residual;
  std::complex<double>::operator*=((complex<double> *)&local_f8,(complex<double> *)local_c8);
  if (local_90 == (TPZFMatrix<std::complex<double>_> *)0x0) {
    local_d8._0_8_ = local_f8 + 1.0;
    local_d8._8_8_ = dStack_f0 + 0.0;
  }
  else {
    Dot<std::complex<double>>(local_90,local_90);
    if (__x < 0.0) {
      local_d8._0_8_ = sqrt(__x);
    }
    else {
      local_d8._0_8_ = SQRT(__x);
    }
    local_d8._8_8_ = 0.0;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  local_70 = CONCAT44(extraout_var,iVar5);
  local_80 = (local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar7 = 0;
  local_78 = -1;
  local_48 = local_70 + -1;
  if (direction != -1) {
    local_48 = lVar7;
    local_78 = local_70;
  }
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = 0.0;
  uVar13 = local_d8._8_4_;
  uVar14 = local_d8._12_4_;
  auVar12 = local_d8;
  uVar15 = uVar13;
  uVar16 = uVar14;
  if (0 < *local_b8) {
    local_40 = (ulong)(direction != -1) * 2 + -1;
    lVar7 = 0;
    do {
      local_e8 = (double)CONCAT44(uVar14,uVar13);
      _uStack_e0 = CONCAT44(uVar16,uVar15);
      local_d8 = auVar12;
      dVar10 = cabs(auVar12._0_8_);
      dVar11 = ABS(*local_88);
      if (ABS(dVar10) <= dVar11) {
        auVar12 = local_d8;
        uVar13 = (undefined4)local_e8;
        uVar14 = local_e8._4_4_;
        uVar15 = uStack_e0;
        uVar16 = uStack_dc;
        break;
      }
      local_50 = lVar7;
      if (local_80 < 1) {
        local_68 = 0.0;
        dStack_60 = 0.0;
      }
      else {
        local_68 = 0.0;
        dStack_60 = 0.0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_d8._8_8_;
        local_d8 = auVar4 << 0x40;
        lVar7 = 0;
        do {
          lVar9 = local_48;
          if (local_48 != local_78) {
            do {
              (*(local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(local_b0,lVar9,lVar7);
              dStack_c0 = dVar11;
              local_c8 = (undefined1  [8])extraout_XMM0_Qa;
              dVar11 = dStack_c0;
              if (0 < local_70) {
                lVar6 = 0;
                lVar8 = 0;
                do {
                  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar9,lVar8);
                  if (((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                       lVar8) ||
                     ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      lVar7)) {
                    local_a8 = dVar11;
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_f8 = extraout_XMM0_Qa_00;
                  dStack_f0 = dVar11;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_f8,
                             (complex<double> *)
                             (result->fElem->_M_value +
                             lVar6 + (result->super_TPZMatrix<std::complex<double>_>).
                                     super_TPZBaseMatrix.fRow * local_d8._0_8_));
                  local_c8 = (undefined1  [8])((double)local_c8 - local_f8);
                  dStack_c0 = dStack_c0 - dStack_f0;
                  lVar8 = lVar8 + 1;
                  lVar6 = lVar6 + 0x10;
                } while (local_70 != lVar8);
              }
              local_f8 = (double)local_c8;
              dStack_f0 = dStack_c0;
              std::complex<double>::operator*=
                        ((complex<double> *)&local_f8,(complex<double> *)local_c8);
              local_68 = local_68 + local_f8;
              dStack_60 = dStack_60 + dStack_f0;
              local_f8 = local_38;
              dStack_f0 = 0.0;
              std::complex<double>::operator*=
                        ((complex<double> *)&local_f8,(complex<double> *)local_c8);
              local_e8 = local_f8;
              local_a8 = dStack_f0;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar9,lVar9);
              uVar13 = SUB84(local_a8,0);
              uVar14 = (undefined4)((ulong)local_a8 >> 0x20);
              uVar15 = 0;
              uVar16 = 0;
              dVar10 = (double)__divdc3(local_e8,uVar13,extraout_XMM0_Qa_01,dVar11);
              dVar11 = (double)CONCAT44(uVar14,uVar13);
              if (((lVar9 < 0) ||
                  ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                   lVar9)) ||
                 ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar7
                 )) {
                local_a8 = (double)CONCAT44(uVar14,uVar13);
                local_e8 = dVar10;
                uStack_a0 = uVar15;
                uStack_9c = uVar16;
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar6 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                      lVar7;
              pcVar1 = result->fElem + lVar6 + lVar9;
              dVar3 = *(double *)(pcVar1->_M_value + 8);
              pcVar2 = result->fElem + lVar6 + lVar9;
              *(double *)pcVar2->_M_value = dVar10 + *(double *)pcVar1->_M_value;
              *(double *)(pcVar2->_M_value + 8) = (double)CONCAT44(uVar14,uVar13) + dVar3;
              lVar9 = lVar9 + local_40;
            } while (lVar9 != local_78);
          }
          lVar7 = lVar7 + 1;
          local_d8._0_8_ = local_d8._0_8_ + 0x10;
        } while (lVar7 != local_80);
      }
      uVar13 = SUB84(dStack_60,0);
      uVar14 = (undefined4)((ulong)dStack_60 >> 0x20);
      uVar15 = uVar13;
      uVar16 = uVar14;
      auVar12._0_8_ = csqrt(local_68);
      auVar12._8_8_ = extraout_XMM0_Qb;
      lVar7 = local_50 + 1;
    } while (lVar7 < *local_b8);
  }
  dVar11 = auVar12._0_8_;
  if (local_90 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    local_e8 = (double)CONCAT44(uVar14,uVar13);
    _uStack_e0 = CONCAT44(uVar16,uVar15);
    local_d8 = auVar12;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,local_b0);
    dVar11 = (double)local_d8._0_8_;
  }
  *local_b8 = lVar7;
  dVar11 = cabs(dVar11);
  *local_88 = ABS(dVar11);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}